

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O2

void __thiscall
ELFIO::segment_impl<ELFIO::Elf64_Phdr>::load
          (segment_impl<ELFIO::Elf64_Phdr> *this,istream *stream,streampos header_offset)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  undefined4 extraout_var_00;
  
  std::istream::seekg((long)stream,_S_beg);
  sVar2 = std::istream::tellg();
  this->stream_size = sVar2;
  std::istream::seekg(stream,header_offset._M_off,header_offset._M_state);
  std::istream::read((char *)stream,(long)&this->ph);
  this->is_offset_set = true;
  iVar1 = (*(this->super_segment)._vptr_segment[3])(this);
  if (iVar1 != 0) {
    iVar1 = (*(this->super_segment)._vptr_segment[0xd])(this);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      uVar3 = (this->ph).p_offset;
      uVar5 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      if (this->convertor->need_conversion == false) {
        uVar5 = uVar3;
      }
      std::istream::seekg(stream,uVar5,0);
      iVar1 = (*(this->super_segment)._vptr_segment[0xd])(this);
      uVar3 = CONCAT44(extraout_var_00,iVar1);
      if (this->stream_size < uVar3) {
        this->data = (char *)0x0;
      }
      else {
        pcVar4 = (char *)operator_new__(uVar3 + 1);
        this->data = pcVar4;
        std::istream::read((char *)stream,(long)pcVar4);
        this->data[uVar3] = '\0';
      }
    }
  }
  return;
}

Assistant:

void
    load( std::istream&  stream,
          std::streampos header_offset )
    {

	stream.seekg ( 0, stream.end );
	set_stream_size ( stream.tellg() );

        stream.seekg( header_offset );
        stream.read( reinterpret_cast<char*>( &ph ), sizeof( ph ) );
        is_offset_set = true;

        if ( PT_NULL != get_type() && 0 != get_file_size() ) {
            stream.seekg( (*convertor)( ph.p_offset ) );
            Elf_Xword size = get_file_size();
	    if ( size > get_stream_size() ) {
		data = 0;
	    } else {
		try {
		    data = new char[size + 1];
		} catch (const std::bad_alloc&) {
		    data = 0;
		}
		if ( 0 != data ) {
		    stream.read( data, size );
		    data[size] = 0;
		}
	    }
        }
    }